

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-util.c
# Opt level: O0

_Bool player_can_debug_prereq(void)

{
  _Bool _Var1;
  _Bool local_9;
  
  if ((player->noscore & 8) == 0) {
    _Var1 = confirm_debug();
    if (_Var1) {
      player->noscore = player->noscore | 8;
      local_9 = true;
    }
    else {
      local_9 = false;
    }
  }
  else {
    local_9 = true;
  }
  return local_9;
}

Assistant:

bool player_can_debug_prereq(void)
{
	if (player->noscore & NOSCORE_DEBUG) {
		return true;
	}
	if (confirm_debug()) {
		/* Mark savefile */
		player->noscore |= NOSCORE_DEBUG;
		return true;
	}
	return false;
}